

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModeXCodeRecord.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::ModeXCodeRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ModeXCodeRecord *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"On/Off Status:       ",0x15);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(local_190,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Damage Status:       ",0x15);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Malfunction Status:  ",0x15);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString ModeXCodeRecord::GetAsString() const
{
    KStringStream ss;

	ss << "On/Off Status:       " << ( KBOOL )m_CodeUnion.m_ui16OnOff << "\n"
	   << "Damage Status:       " << ( KBOOL )m_CodeUnion.m_ui16Dmg   << "\n"
	   << "Malfunction Status:  " << ( KBOOL )m_CodeUnion.m_ui16MalFnc << "\n";

    return ss.str();
}